

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

bool __thiscall
CScript::IsWitnessProgram
          (CScript *this,int *version,vector<unsigned_char,_std::allocator<unsigned_char>_> *program
          )

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  CScript *pCVar6;
  long in_FS_OFFSET;
  allocator_type local_39;
  vector<unsigned_char,std::allocator<unsigned_char>> local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (this->super_CScriptBase)._size;
  uVar2 = uVar5 - 0x1d;
  if (uVar5 < 0x1d) {
    uVar2 = uVar5;
  }
  if (0xffffffd8 < uVar2 - 0x2b) {
    pCVar6 = this;
    if (0x1c < uVar5) {
      pCVar6 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    }
    bVar1 = (pCVar6->super_CScriptBase)._union.direct[0];
    if ((bVar1 == 0 || 0xef < (byte)(bVar1 + 0x9f)) &&
       ((byte)(pCVar6->super_CScriptBase)._union.direct[1] + 2 == uVar2)) {
      iVar4 = DecodeOP_N((uint)bVar1);
      *version = iVar4;
      uVar5 = (this->super_CScriptBase)._size;
      if (0x1c < uVar5) {
        this = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
        uVar5 = uVar5 - 0x1d;
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                (local_38,(uchar *)((long)&(this->super_CScriptBase)._union + 2),
                 (uchar *)((long)&(this->super_CScriptBase)._union + (long)(int)uVar5),&local_39);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(program,local_38);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
      bVar3 = true;
      goto LAB_00394e6d;
    }
  }
  bVar3 = false;
LAB_00394e6d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CScript::IsWitnessProgram(int& version, std::vector<unsigned char>& program) const
{
    if (this->size() < 4 || this->size() > 42) {
        return false;
    }
    if ((*this)[0] != OP_0 && ((*this)[0] < OP_1 || (*this)[0] > OP_16)) {
        return false;
    }
    if ((size_t)((*this)[1] + 2) == this->size()) {
        version = DecodeOP_N((opcodetype)(*this)[0]);
        program = std::vector<unsigned char>(this->begin() + 2, this->end());
        return true;
    }
    return false;
}